

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

int is_warped_mode_allowed(AV1_COMP *cpi,MACROBLOCK *x,MB_MODE_INFO *mbmi)

{
  int iVar1;
  WarpedMotionParams *gm_params;
  MACROBLOCKD *xd_00;
  MB_MODE_INFO *in_RDX;
  long in_RSI;
  long in_RDI;
  MOTION_MODE last_motion_mode_allowed;
  MACROBLOCKD *xd;
  FeatureFlags *features;
  uint7 in_stack_ffffffffffffffc8;
  MOTION_MODE MVar2;
  int local_4;
  
  gm_params = (WarpedMotionParams *)(in_RDI + 0x3c16c);
  xd_00 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  if (*(int *)(in_RDI + 0x60b38) == 0) {
    iVar1 = has_second_ref(in_RDX);
    if (iVar1 == 0) {
      MVar2 = '\0';
      if ((*(byte *)((long)gm_params->wmmat + 0xb) & 1) != 0) {
        MVar2 = motion_mode_allowed(gm_params,xd_00,(MB_MODE_INFO *)(ulong)in_stack_ffffffffffffffc8
                                    ,0);
      }
      if (MVar2 == '\x02') {
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int is_warped_mode_allowed(const AV1_COMP *cpi,
                                         MACROBLOCK *const x,
                                         const MB_MODE_INFO *mbmi) {
  const FeatureFlags *const features = &cpi->common.features;
  const MACROBLOCKD *xd = &x->e_mbd;

  if (cpi->sf.inter_sf.extra_prune_warped) return 0;
  if (has_second_ref(mbmi)) return 0;
  MOTION_MODE last_motion_mode_allowed = SIMPLE_TRANSLATION;

  if (features->switchable_motion_mode) {
    // Determine which motion modes to search if more than SIMPLE_TRANSLATION
    // is allowed.
    last_motion_mode_allowed = motion_mode_allowed(
        xd->global_motion, xd, mbmi, features->allow_warped_motion);
  }

  if (last_motion_mode_allowed == WARPED_CAUSAL) {
    return 1;
  }

  return 0;
}